

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

void __thiscall TaprootSpendData::Merge(TaprootSpendData *this,TaprootSpendData other)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  _Rb_tree_node_base *p_Var6;
  base_blob<256U> *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = base_blob<256U>::IsNull((base_blob<256U> *)this);
  if (bVar5) {
    bVar5 = base_blob<256U>::IsNull(in_RSI);
    if (!bVar5) {
      uVar2 = *(undefined8 *)(in_RSI->m_data)._M_elems;
      uVar3 = *(undefined8 *)((in_RSI->m_data)._M_elems + 8);
      uVar4 = *(undefined8 *)((in_RSI->m_data)._M_elems + 0x18);
      *(undefined8 *)((this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)((in_RSI->m_data)._M_elems + 0x10);
      *(undefined8 *)((this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) =
           uVar4;
      *(undefined8 *)(this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems = uVar2;
      *(undefined8 *)((this->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
           uVar3;
    }
  }
  bVar5 = base_blob<256U>::IsNull(&(this->merkle_root).super_base_blob<256U>);
  if (bVar5) {
    bVar5 = base_blob<256U>::IsNull(in_RSI + 1);
    if (!bVar5) {
      uVar2 = *(undefined8 *)in_RSI[1].m_data._M_elems;
      uVar3 = *(undefined8 *)(in_RSI[1].m_data._M_elems + 8);
      uVar4 = *(undefined8 *)(in_RSI[1].m_data._M_elems + 0x18);
      *(undefined8 *)((this->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)(in_RSI[1].m_data._M_elems + 0x10);
      *(undefined8 *)((this->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar4;
      *(undefined8 *)(this->merkle_root).super_base_blob<256U>.m_data._M_elems = uVar2;
      *(undefined8 *)((this->merkle_root).super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
    }
  }
  for (p_Var6 = *(_Rb_tree_node_base **)(in_RSI[2].m_data._M_elems + 0x18);
      p_Var6 != (_Rb_tree_node_base *)(in_RSI[2].m_data._M_elems + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    this_00 = &std::
               map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
               ::operator[](&this->scripts,(key_type *)(p_Var6 + 1))->_M_t;
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::_M_merge_unique<ShortestVectorFirstComparator>
              (this_00,(_Compatible_tree<ShortestVectorFirstComparator> *)(p_Var6 + 2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TaprootSpendData::Merge(TaprootSpendData other)
{
    // TODO: figure out how to better deal with conflicting information
    // being merged.
    if (internal_key.IsNull() && !other.internal_key.IsNull()) {
        internal_key = other.internal_key;
    }
    if (merkle_root.IsNull() && !other.merkle_root.IsNull()) {
        merkle_root = other.merkle_root;
    }
    for (auto& [key, control_blocks] : other.scripts) {
        scripts[key].merge(std::move(control_blocks));
    }
}